

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::GraphicsPipeline::GraphicsPipeline
          (GraphicsPipeline *this,OperationContext *context,ResourceType resourceType,
          VkBuffer indirectBuffer,string *shaderPrefix,VkDescriptorSetLayout descriptorSetLayout)

{
  VkImageSubresourceRange *pVVar1;
  VkPipelineLayout pipelineLayout;
  VkRenderPass renderPass;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data;
  VkImageSubresourceRange subresourceRange;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  RefData<vk::Handle<(vk::HandleType)17>_> data_01;
  RefData<vk::Handle<(vk::HandleType)23>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Allocator *pAVar5;
  Allocator *device_00;
  VkDevice pVVar6;
  VkFormat vertexFormat;
  deUint32 stride;
  Image *pIVar7;
  VkImage *pVVar8;
  Handle<(vk::HandleType)17> *pHVar9;
  Handle<(vk::HandleType)13> *pHVar10;
  GraphicsPipelineBuilder *pGVar11;
  ProgramCollection<vk::ProgramBinary> *pPVar12;
  ProgramBinary *pPVar13;
  Handle<(vk::HandleType)16> *pHVar14;
  PipelineCacheData *pipelineCacheData;
  VkExtent3D VVar15;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  Move<vk::Handle<(vk::HandleType)18>_> local_3e0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  Vector<int,_2> local_360;
  undefined1 local_358 [8];
  GraphicsPipelineBuilder pipelineBuilder;
  Move<vk::Handle<(vk::HandleType)16>_> local_248;
  RefData<vk::Handle<(vk::HandleType)16>_> local_228;
  deUint64 local_208;
  VkRenderPass local_200;
  Move<vk::Handle<(vk::HandleType)23>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)23>_> local_1d8;
  Move<vk::Handle<(vk::HandleType)17>_> local_1b8;
  RefData<vk::Handle<(vk::HandleType)17>_> local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  deUint32 local_168;
  deUint64 local_158;
  Move<vk::Handle<(vk::HandleType)13>_> local_150;
  RefData<vk::Handle<(vk::HandleType)13>_> local_130;
  DefaultDeleter<vkt::synchronization::Image> local_10d;
  deUint32 local_10c;
  VkImageCreateInfo local_108;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> local_b0;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *local_a0;
  VkExtent3D local_90;
  undefined8 local_80;
  deUint32 local_78;
  VkImageSubresourceRange local_74;
  Allocator *local_60;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  string *local_38;
  string *shaderPrefix_local;
  OperationContext *pOStack_28;
  ResourceType resourceType_local;
  OperationContext *context_local;
  GraphicsPipeline *this_local;
  VkDescriptorSetLayout descriptorSetLayout_local;
  VkBuffer indirectBuffer_local;
  
  local_38 = shaderPrefix;
  shaderPrefix_local._4_4_ = resourceType;
  pOStack_28 = context;
  context_local = (OperationContext *)this;
  this_local = (GraphicsPipeline *)descriptorSetLayout.m_internal;
  descriptorSetLayout_local.m_internal = indirectBuffer.m_internal;
  Pipeline::Pipeline(&this->super_Pipeline);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__GraphicsPipeline_01670360;
  this->m_resourceType = shaderPrefix_local._4_4_;
  (this->m_indirectBuffer).m_internal = descriptorSetLayout_local.m_internal;
  VertexGrid::VertexGrid(&this->m_vertices,pOStack_28);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            (&this->m_colorAttachmentImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  device = (VkDevice)OperationContext::getDeviceInterface(pOStack_28);
  allocator = (Allocator *)OperationContext::getDevice(pOStack_28);
  local_60 = OperationContext::getAllocator(pOStack_28);
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  ::vk::makeImageSubresourceRange(&local_74,1,0,1,0,1);
  (this->m_colorImageSubresourceRange).layerCount = local_74.layerCount;
  (this->m_colorImageSubresourceRange).aspectMask = local_74.aspectMask;
  (this->m_colorImageSubresourceRange).baseMipLevel = local_74.baseMipLevel;
  (this->m_colorImageSubresourceRange).levelCount = local_74.levelCount;
  (this->m_colorImageSubresourceRange).baseArrayLayer = local_74.baseArrayLayer;
  VVar15 = ::vk::makeExtent3D(0x10,0x10,1);
  local_90.depth = VVar15.depth;
  local_78 = local_90.depth;
  local_90._0_8_ = VVar15._0_8_;
  local_80._0_4_ = local_90.width;
  local_80._4_4_ = local_90.height;
  (this->m_colorImageExtent).depth = local_90.depth;
  (this->m_colorImageExtent).width = local_90.width;
  (this->m_colorImageExtent).height = local_90.height;
  local_90 = VVar15;
  pIVar7 = (Image *)operator_new(0x30);
  pVVar6 = device;
  device_00 = allocator;
  pAVar5 = local_60;
  makeImageCreateInfo(&local_108,VK_IMAGE_TYPE_2D,&this->m_colorImageExtent,this->m_colorFormat,0x10
                     );
  local_10c = ::vk::MemoryRequirement::Any.m_flags;
  synchronization::Image::Image
            (pIVar7,(DeviceInterface *)pVVar6,(VkDevice)device_00,pAVar5,&local_108,
             ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::synchronization::Image>::DefaultDeleter(&local_10d);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_b0);
  local_a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_b0,(MovePtr *)pIVar7);
  data.ptr._4_4_ = in_stack_fffffffffffffadc;
  data.ptr._0_4_ = in_stack_fffffffffffffad8;
  data._8_4_ = in_stack_fffffffffffffae0;
  data._12_4_ = in_stack_fffffffffffffae4;
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::operator=
            (&this->m_colorAttachmentImage,data);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_b0);
  pVVar6 = device;
  pAVar5 = allocator;
  pIVar7 = de::details::
           UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
           ::operator*(&(this->m_colorAttachmentImage).
                        super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                      );
  pVVar8 = synchronization::Image::operator*(pIVar7);
  local_158 = pVVar8->m_internal;
  local_168 = (this->m_colorImageSubresourceRange).layerCount;
  pVVar1 = &this->m_colorImageSubresourceRange;
  local_178._0_4_ = pVVar1->aspectMask;
  local_178._4_4_ = pVVar1->baseMipLevel;
  uStack_170._0_4_ = (this->m_colorImageSubresourceRange).levelCount;
  uStack_170._4_4_ = (this->m_colorImageSubresourceRange).baseArrayLayer;
  uVar2 = pVVar1->aspectMask;
  uVar3 = pVVar1->baseMipLevel;
  uVar4 = pVVar1->levelCount;
  subresourceRange.levelCount = uVar4;
  subresourceRange.baseMipLevel = uVar3;
  subresourceRange.aspectMask = uVar2;
  subresourceRange.baseArrayLayer = uStack_170._4_4_;
  subresourceRange.layerCount = local_168;
  makeImageView(&local_150,(DeviceInterface *)pVVar6,(VkDevice)pAVar5,(VkImage)local_158,
                VK_IMAGE_VIEW_TYPE_2D,this->m_colorFormat,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data_00.object.m_internal = local_130.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_130.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_130.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_130.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorAttachmentView,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_150);
  makeRenderPass(&local_1b8,(DeviceInterface *)device,(VkDevice)allocator,this->m_colorFormat);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_198,(Move *)&local_1b8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_198.deleter.m_deviceIface;
  data_01.object.m_internal = local_198.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_198.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_198.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_198.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_198.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_1b8);
  pVVar6 = device;
  pAVar5 = allocator;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_200.m_internal = pHVar9->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>
                      );
  local_208 = pHVar10->m_internal;
  makeFramebuffer(&local_1f8,(DeviceInterface *)pVVar6,(VkDevice)pAVar5,local_200,
                  (VkImageView)local_208,(this->m_colorImageExtent).width,
                  (this->m_colorImageExtent).height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_1d8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1d8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1d8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_1d8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_1d8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_1d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_1f8);
  pipelineBuilder._256_8_ = this_local;
  makePipelineLayout(&local_248,(DeviceInterface *)device,(VkDevice)allocator,
                     (VkDescriptorSetLayout)this_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_228,(Move *)&local_248);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_228.deleter.m_deviceIface;
  data_03.object.m_internal = local_228.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_228.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_228.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_228.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator = local_228.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_248);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_358);
  tcu::Vector<int,_2>::Vector
            (&local_360,(this->m_colorImageExtent).width,(this->m_colorImageExtent).height);
  pGVar11 = GraphicsPipelineBuilder::setRenderSize((GraphicsPipelineBuilder *)local_358,&local_360);
  vertexFormat = VertexGrid::getVertexFormat(&this->m_vertices);
  stride = VertexGrid::getVertexStride(&this->m_vertices);
  pGVar11 = GraphicsPipelineBuilder::setVertexInputSingleAttribute(pGVar11,vertexFormat,stride);
  pVVar6 = device;
  pAVar5 = allocator;
  pPVar12 = OperationContext::getBinaryCollection(pOStack_28);
  std::operator+(&local_380,local_38,"vert");
  pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_380);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,(DeviceInterface *)pVVar6,(VkDevice)pAVar5,VK_SHADER_STAGE_VERTEX_BIT
                       ,pPVar13,(VkSpecializationInfo *)0x0);
  pVVar6 = device;
  pAVar5 = allocator;
  pPVar12 = OperationContext::getBinaryCollection(pOStack_28);
  std::operator+(&local_3a0,local_38,"frag");
  pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_3a0);
  GraphicsPipelineBuilder::setShader
            (pGVar11,(DeviceInterface *)pVVar6,(VkDevice)pAVar5,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar13
             ,(VkSpecializationInfo *)0x0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  pVVar6 = device;
  pAVar5 = allocator;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineLayout.m_internal = pHVar14->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar9->m_internal;
  pipelineCacheData = OperationContext::getPipelineCacheData(pOStack_28);
  GraphicsPipelineBuilder::build
            (&local_3e0,(GraphicsPipelineBuilder *)local_358,(DeviceInterface *)pVVar6,
             (VkDevice)pAVar5,pipelineLayout,renderPass,pipelineCacheData);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3c0,(Move *)&local_3e0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_3c0.deleter.m_deviceIface;
  data_04.object.m_internal = local_3c0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_3c0.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_3c0.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator = local_3c0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_3e0);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_358);
  return;
}

Assistant:

GraphicsPipeline (OperationContext&				context,
					  const ResourceType			resourceType,
					  const VkBuffer				indirectBuffer,
					  const std::string&			shaderPrefix,
					  const VkDescriptorSetLayout	descriptorSetLayout)
		: m_resourceType	(resourceType)
		, m_indirectBuffer	(indirectBuffer)
		, m_vertices		(context)
	{
		const DeviceInterface&		vk				= context.getDeviceInterface();
		const VkDevice				device			= context.getDevice();
		Allocator&					allocator		= context.getAllocator();

		// Color attachment

		m_colorFormat					= VK_FORMAT_R8G8B8A8_UNORM;
		m_colorImageSubresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		m_colorImageExtent				= makeExtent3D(16u, 16u, 1u);
		m_colorAttachmentImage			= de::MovePtr<Image>(new Image(vk, device, allocator,
			makeImageCreateInfo(VK_IMAGE_TYPE_2D, m_colorImageExtent, m_colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT),
			MemoryRequirement::Any));

		// Pipeline

		m_colorAttachmentView	= makeImageView		(vk, device, **m_colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorImageSubresourceRange);
		m_renderPass			= makeRenderPass	(vk, device, m_colorFormat);
		m_framebuffer			= makeFramebuffer	(vk, device, *m_renderPass, *m_colorAttachmentView, m_colorImageExtent.width, m_colorImageExtent.height, 1u);
		m_pipelineLayout		= makePipelineLayout(vk, device, descriptorSetLayout);

		GraphicsPipelineBuilder pipelineBuilder;
		pipelineBuilder
			.setRenderSize					(tcu::IVec2(m_colorImageExtent.width, m_colorImageExtent.height))
			.setVertexInputSingleAttribute	(m_vertices.getVertexFormat(), m_vertices.getVertexStride())
			.setShader						(vk, device, VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get(shaderPrefix + "vert"), DE_NULL)
			.setShader						(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get(shaderPrefix + "frag"), DE_NULL);

		m_pipeline = pipelineBuilder.build(vk, device, *m_pipelineLayout, *m_renderPass, context.getPipelineCacheData());
	}